

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O2

void __thiscall
SolverTest_OptionHeader_Test::TestBody()::OptionTestSolver::~OptionTestSolver
          (OptionTestSolver *this)

{
  SolverTest_OptionHeader_Test::TestBody::OptionTestSolver::~OptionTestSolver
            ((OptionTestSolver *)(this + -0x28));
  return;
}

Assistant:

TEST(SolverTest, OptionHeader) {
  struct OptionTestSolver : Solver {
    OptionTestSolver() : Solver("testsolver", 0, 0, 0) {}
    void set_option_header() {
      Solver::set_option_header("test header");
    }
    int DoSolve(Problem &, SolutionHandler &) { return 0; }
    void ReadNL(fmt::StringRef) {}
  } s;
  EXPECT_STREQ("", s.option_header());
  s.set_option_header();
  EXPECT_STREQ("test header", s.option_header());
}